

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
mjs::object::debug_print(object *this,wostream *os,int indent_incr,int max_nest,int indent)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  bool bVar1;
  wostream *pwVar2;
  gc_vector<mjs::object::property> *this_00;
  property *ppVar3;
  size_type __n;
  wstring_view wVar4;
  allocator<wchar_t> local_199;
  wstring local_198 [32];
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_178;
  size_t local_168;
  wchar_t *pwStack_160;
  value local_150;
  property local_128;
  undefined1 auStack_118 [8];
  wstring_view key;
  property *p;
  property *__end1;
  property *__begin1;
  gc_vector<mjs::object::property> *__range1;
  object_ptr local_e0;
  value local_d0;
  undefined1 local_a8 [16];
  wostream *local_98;
  anon_class_40_5_625ec95e print_prop;
  wstring local_68 [8];
  wstring indent_string;
  undefined1 local_38 [28];
  int indent_local;
  int max_nest_local;
  int indent_incr_local;
  wostream *os_local;
  object *this_local;
  
  local_38._20_4_ = indent;
  local_38._24_4_ = max_nest;
  indent_local = indent_incr;
  _max_nest_local = os;
  os_local = (wostream *)this;
  if ((indent / indent_incr < 5) && (0 < max_nest)) {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              (local_68,(long)(indent + indent_incr),L' ',
               (allocator<wchar_t> *)((long)&print_prop.indent + 7));
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&print_prop.indent + 7));
    local_98 = _max_nest_local;
    print_prop.os = (wostream *)local_68;
    print_prop.indent_string = (wstring *)&indent_local;
    print_prop.indent_incr = (int *)(local_38 + 0x18);
    print_prop.max_nest = (int *)(local_38 + 0x14);
    std::operator<<(_max_nest_local,"{\n");
    class_name((object *)local_a8);
    const::$_0::operator()((__0 *)&local_98,(char (*) [10])"[[Class]]",(string *)local_a8,true);
    string::~string((string *)local_a8);
    bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool
                      ((gc_heap_ptr_untracked *)&this->prototype_);
    if (bVar1) {
      heap(this);
      gc_heap_ptr_untracked<mjs::object,_true>::track
                ((gc_heap_ptr_untracked<mjs::object,_true> *)&local_e0,(gc_heap *)&this->prototype_)
      ;
      value::value(&local_d0,&local_e0);
    }
    else {
      value::value(&local_d0,(value *)value::null);
    }
    const::$_0::operator()((__0 *)&local_98,(char (*) [14])"[[Prototype]]",&local_d0,true);
    value::~value(&local_d0);
    if (bVar1) {
      gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_e0);
    }
    this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                        (&this->properties_,this->heap_);
    __end1 = gc_vector<mjs::object::property>::begin(this_00);
    ppVar3 = gc_vector<mjs::object::property>::end(this_00);
    for (; __end1 != ppVar3; __end1 = __end1 + 1) {
      key._M_str = (wchar_t *)__end1;
      property::key(&local_128,(gc_heap *)__end1);
      wVar4 = string::view((string *)&local_128);
      key._M_len = (size_t)wVar4._M_str;
      auStack_118 = (undefined1  [8])wVar4._M_len;
      string::~string((string *)&local_128);
      property::get(&local_150,(property *)key._M_str,this);
      local_168 = (size_t)auStack_118;
      pwStack_160 = (wchar_t *)key._M_len;
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_178,L"constructor");
      __x._M_str = pwStack_160;
      __x._M_len = local_168;
      bVar1 = std::operator==(__x,local_178);
      const::$_0::operator()
                ((__0 *)&local_98,
                 (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_118,&local_150,
                 bVar1);
      value::~value(&local_150);
    }
    (*this->_vptr_object[8])
              (this,_max_nest_local,(ulong)(uint)indent_local,(ulong)(uint)local_38._24_4_,
               (ulong)(uint)(local_38._20_4_ + indent_local));
    pwVar2 = _max_nest_local;
    __n = (size_type)(int)local_38._20_4_;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_198,__n,L' ',&local_199);
    pwVar2 = std::operator<<(pwVar2,local_198);
    std::operator<<(pwVar2,"}");
    std::__cxx11::wstring::~wstring(local_198);
    std::allocator<wchar_t>::~allocator(&local_199);
    std::__cxx11::wstring::~wstring(local_68);
  }
  else {
    pwVar2 = std::operator<<(os,"[Object ");
    class_name((object *)local_38);
    pwVar2 = mjs::operator<<(pwVar2,(string *)local_38);
    std::operator<<(pwVar2,"]");
    string::~string((string *)local_38);
  }
  return;
}

Assistant:

void object::debug_print(std::wostream& os, int indent_incr, int max_nest, int indent) const {
    if (indent / indent_incr > 4 || max_nest <= 0) {
        os << "[Object " << class_name() << "]";
        return;
    }
    auto indent_string = std::wstring(indent + indent_incr, ' ');
    auto print_prop = [&](const auto& name, const auto& val, bool internal) {
        os << indent_string << name << ": ";
        mjs::debug_print(os, mjs::value{val}, indent_incr, max_nest > 1 && internal ? 1 : max_nest - 1, indent + indent_incr);
        os << "\n";
    };
    os << "{\n";
    print_prop("[[Class]]", class_name(), true);
    print_prop("[[Prototype]]", prototype_ ? value{prototype_.track(heap())} : value::null, true);
    for (auto& p: properties_.dereference(heap_)) {
        const auto key = p.key(heap_).view();
        print_prop(key, p.get(*this), key == L"constructor");
    }
    do_debug_print_extra(os, indent_incr, max_nest, indent+indent_incr);
    os << std::wstring(indent, ' ') << "}";
}